

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::Histogram(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
                        vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  uint8_t uVar1;
  bool bVar2;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar3;
  reference puVar4;
  Image *pIVar5;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R9;
  ImageManager manager;
  HistogramForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  HistogramForm4 func;
  ImageTypeManager *registrator;
  undefined7 in_stack_fffffffffffffed8;
  uint8_t in_stack_fffffffffffffedf;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffee0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef0;
  ImageTypeManager *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  uint8_t in_stack_ffffffffffffff1f;
  ImageTypeManager *in_stack_ffffffffffffff20;
  ImageManager *in_stack_ffffffffffffff28;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined7 in_stack_ffffffffffffffc8;
  HistogramForm4 func_00;
  HistogramForm4 p_Var6;
  
  this = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar3 = ImageTypeManager::functionTable(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
  func_00 = pFVar3->Histogram;
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((func_00 == (HistogramForm4)0x0) &&
     (bVar2 = ImageTypeManager::isIntertypeConversionEnabled(this), bVar2)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    local_40 = local_58;
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffee0,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_60);
      pFVar3 = ImageTypeManager::functionTable(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
      p_Var6 = pFVar3->Histogram;
      if (p_Var6 != (HistogramForm4)0x0) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_60);
        uVar1 = *puVar4;
        func_00 = p_Var6;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_60);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffef0);
  }
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>&)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint_vector<unsigned_int,_std::allocator<unsigned_int>_>_ptr
              *)func_00,(char *)CONCAT17(uVar1,in_stack_ffffffffffffffc8));
  anon_unknown.dwarf_84a6f::ImageManager::ImageManager
            ((ImageManager *)&stack0xffffffffffffff10,in_stack_fffffffffffffedf);
  pIVar5 = anon_unknown.dwarf_84a6f::ImageManager::operator()
                     (in_stack_ffffffffffffff28,(Image *)in_stack_ffffffffffffff20);
  (*func_00)(pIVar5,in_ESI,in_EDX,in_ECX,in_R8D,in_R9);
  anon_unknown.dwarf_84a6f::ImageManager::~ImageManager((ImageManager *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void Histogram( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                    std::vector < uint32_t > & histogram )
    {
        initialize( image, Histogram )
        func( manager(image), x, y, width, height, histogram );
    }